

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

void re2::Regexp::RemoveLeadingString(Regexp *re,int n)

{
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  void *p;
  Regexp *this;
  Regexp *that;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  ulong uVar5;
  Regexp *stk [4];
  undefined *puStack_1d0;
  long local_1c8 [4];
  LogMessage local_1a8;
  
  uVar5 = 0;
  while (uVar1 = re->op_, uVar1 == '\x05') {
    if (uVar5 < 4) {
      local_1c8[uVar5] = (long)re;
      uVar5 = uVar5 + 1;
    }
    if (re->nsub_ < 2) {
      paVar4 = &re->field_5;
    }
    else {
      paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    re = paVar4->subone_;
  }
  if (uVar1 != '\x03') {
    if (uVar1 != '\x04') goto joined_r0x00237368;
    iVar3 = (re->field_7).field_0.max_;
    if (n < iVar3) {
      if (iVar3 + -1 == n) {
        p = (re->field_7).the_union_[1];
        iVar3 = *(int *)((long)p + (long)iVar3 * 4 + -4);
        if (p != (void *)0x0) {
          puStack_1d0 = (undefined *)0x237335;
          operator_delete__(p);
        }
        (re->field_7).field_1.name_ = (string *)0x0;
        (re->field_7).field_0.max_ = iVar3;
        re->op_ = '\x03';
      }
      else {
        (re->field_7).field_0.max_ = iVar3 - n;
        puStack_1d0 = (undefined *)0x237409;
        memmove((re->field_7).the_union_[1],
                (void *)((long)(re->field_7).the_union_[1] + (long)n * 4),(long)(iVar3 - n) << 2);
      }
      goto joined_r0x00237368;
    }
    if ((re->field_7).the_union_[1] != (void *)0x0) {
      puStack_1d0 = (undefined *)0x237353;
      operator_delete__((re->field_7).the_union_[1]);
    }
    (re->field_7).field_1.name_ = (string *)0x0;
  }
  (re->field_7).field_0.max_ = 0;
  re->op_ = '\x02';
joined_r0x00237368:
  do {
    if (uVar5 == 0) {
      return;
    }
    this = (Regexp *)(&puStack_1d0)[uVar5];
    if (this->nsub_ < 2) {
      paVar4 = &this->field_5;
    }
    else {
      paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    if (paVar4->subone_->op_ == '\x02') {
      puStack_1d0 = (undefined *)0x23738d;
      Decref(paVar4->subone_);
      paVar4->submany_ = (Regexp **)0x0;
      uVar2 = this->nsub_;
      if (uVar2 == 2) {
        that = paVar4[1].subone_;
        paVar4[1].submany_ = (Regexp **)0x0;
        puStack_1d0 = (undefined *)0x2373d0;
        Swap(this,that);
        puStack_1d0 = (undefined *)0x2373d8;
        Decref(that);
      }
      else {
        if (uVar2 < 2) {
          puStack_1d0 = (undefined *)0x237424;
          LogMessage::LogMessage
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/parse.cc"
                     ,0x351);
          puStack_1d0 = (undefined *)0x23743d;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8.str_.super_basic_ostream<char,_std::char_traits<char>_>,"Concat of "
                     ,10);
          puStack_1d0 = (undefined *)0x237449;
          std::ostream::operator<<(&local_1a8.str_,(uint)this->nsub_);
          puStack_1d0 = &UNK_00237455;
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
        }
        this->nsub_ = uVar2 - 1;
        puStack_1d0 = (undefined *)0x2373b7;
        memmove(paVar4,paVar4 + 1,(ulong)(ushort)(uVar2 - 1) << 3);
      }
    }
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

void Regexp::RemoveLeadingString(Regexp* re, int n) {
  // Chase down concats to find first string.
  // For regexps generated by parser, nested concats are
  // flattened except when doing so would overflow the 16-bit
  // limit on the size of a concatenation, so we should never
  // see more than two here.
  Regexp* stk[4];
  size_t d = 0;
  while (re->op() == kRegexpConcat) {
    if (d < arraysize(stk))
      stk[d++] = re;
    re = re->sub()[0];
  }

  // Remove leading string from re.
  if (re->op() == kRegexpLiteral) {
    re->rune_ = 0;
    re->op_ = kRegexpEmptyMatch;
  } else if (re->op() == kRegexpLiteralString) {
    if (n >= re->nrunes_) {
      delete[] re->runes_;
      re->runes_ = NULL;
      re->nrunes_ = 0;
      re->op_ = kRegexpEmptyMatch;
    } else if (n == re->nrunes_ - 1) {
      Rune rune = re->runes_[re->nrunes_ - 1];
      delete[] re->runes_;
      re->runes_ = NULL;
      re->nrunes_ = 0;
      re->rune_ = rune;
      re->op_ = kRegexpLiteral;
    } else {
      re->nrunes_ -= n;
      memmove(re->runes_, re->runes_ + n, re->nrunes_ * sizeof re->runes_[0]);
    }
  }

  // If re is now empty, concatenations might simplify too.
  while (d > 0) {
    re = stk[--d];
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch) {
      sub[0]->Decref();
      sub[0] = NULL;
      // Delete first element of concat.
      switch (re->nsub()) {
        case 0:
        case 1:
          // Impossible.
          LOG(DFATAL) << "Concat of " << re->nsub();
          re->submany_ = NULL;
          re->op_ = kRegexpEmptyMatch;
          break;

        case 2: {
          // Replace re with sub[1].
          Regexp* old = sub[1];
          sub[1] = NULL;
          re->Swap(old);
          old->Decref();
          break;
        }

        default:
          // Slide down.
          re->nsub_--;
          memmove(sub, sub + 1, re->nsub_ * sizeof sub[0]);
          break;
      }
    }
  }
}